

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

int xmlShellRegisterRootNamespaces(xmlShellCtxtPtr ctxt,char *arg,xmlNodePtr root,xmlNodePtr node2)

{
  xmlXPathContextPtr_conflict pxVar1;
  xmlXPathContextPtr_conflict pxVar2;
  int in_EAX;
  char *prefix;
  
  if (((arg != (char *)0x0) && (*(int *)(arg + 8) == 1)) &&
     (pxVar1 = *(xmlXPathContextPtr_conflict *)(arg + 0x60),
     pxVar1 != (xmlXPathContextPtr_conflict)0x0)) {
    pxVar2 = ctxt->pctxt;
    while (pxVar2 != (xmlXPathContextPtr_conflict)0x0) {
      prefix = (char *)pxVar1->varHash;
      if ((xmlHashTablePtr)prefix == (xmlHashTablePtr)0x0) {
        prefix = "defaultns";
      }
      in_EAX = xmlXPathRegisterNs(ctxt->pctxt,(xmlChar *)prefix,
                                  *(xmlChar **)&pxVar1->nb_variables_unused);
      pxVar1 = (xmlXPathContextPtr_conflict)pxVar1->doc;
      pxVar2 = pxVar1;
    }
  }
  return in_EAX;
}

Assistant:

static int
xmlShellRegisterRootNamespaces(xmlShellCtxtPtr ctxt, char *arg ATTRIBUTE_UNUSED,
      xmlNodePtr root, xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlNsPtr ns;

    if ((root == NULL) || (root->type != XML_ELEMENT_NODE) ||
        (root->nsDef == NULL) || (ctxt == NULL) || (ctxt->pctxt == NULL))
	return(-1);
    ns = root->nsDef;
    while (ns != NULL) {
        if (ns->prefix == NULL)
	    xmlXPathRegisterNs(ctxt->pctxt, BAD_CAST "defaultns", ns->href);
	else
	    xmlXPathRegisterNs(ctxt->pctxt, ns->prefix, ns->href);
        ns = ns->next;
    }
    return(0);
}